

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiViewport * ImGui::FindViewportByPlatformHandle(void *platform_handle)

{
  ImGuiContext *pIVar1;
  ImGuiViewportP **ppIVar2;
  int local_24;
  int i;
  ImGuiContext *g;
  void *platform_handle_local;
  
  pIVar1 = GImGui;
  local_24 = 0;
  while( true ) {
    if (local_24 == (pIVar1->Viewports).Size) {
      return (ImGuiViewport *)0x0;
    }
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&pIVar1->Viewports,local_24);
    if (((*ppIVar2)->super_ImGuiViewport).PlatformHandle == platform_handle) break;
    local_24 = local_24 + 1;
  }
  ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&pIVar1->Viewports,local_24);
  return &(*ppIVar2)->super_ImGuiViewport;
}

Assistant:

ImGuiViewport* ImGui::FindViewportByPlatformHandle(void* platform_handle)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.Viewports.Size; i++)
        if (g.Viewports[i]->PlatformHandle == platform_handle)
            return g.Viewports[i];
    return NULL;
}